

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_K256_ECDSA.c
# Opt level: O0

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out,uint64_t *scalar,uint64_t *q)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t x_224;
  uint64_t *os_224;
  uint64_t x_223;
  uint64_t *os_223;
  uint64_t x_222;
  uint64_t *os_222;
  uint64_t x_221;
  uint64_t *os_221;
  uint64_t x_220;
  uint64_t *os_220;
  uint64_t x_219;
  uint64_t *os_219;
  uint64_t x_218;
  uint64_t *os_218;
  uint64_t x_217;
  uint64_t *os_217;
  uint64_t x_216;
  uint64_t *os_216;
  uint64_t x_215;
  uint64_t *os_215;
  uint64_t x_214;
  uint64_t *os_214;
  uint64_t x_213;
  uint64_t *os_213;
  uint64_t x_212;
  uint64_t *os_212;
  uint64_t x_211;
  uint64_t *os_211;
  uint64_t x_210;
  uint64_t *os_210;
  uint32_t i_16;
  uint64_t *res_j_14;
  uint64_t c_14;
  uint64_t x_209;
  uint64_t *os_209;
  uint64_t x_208;
  uint64_t *os_208;
  uint64_t x_207;
  uint64_t *os_207;
  uint64_t x_206;
  uint64_t *os_206;
  uint64_t x_205;
  uint64_t *os_205;
  uint64_t x_204;
  uint64_t *os_204;
  uint64_t x_203;
  uint64_t *os_203;
  uint64_t x_202;
  uint64_t *os_202;
  uint64_t x_201;
  uint64_t *os_201;
  uint64_t x_200;
  uint64_t *os_200;
  uint64_t x_199;
  uint64_t *os_199;
  uint64_t x_198;
  uint64_t *os_198;
  uint64_t x_197;
  uint64_t *os_197;
  uint64_t x_196;
  uint64_t *os_196;
  uint64_t x_195;
  uint64_t *os_195;
  uint32_t i_15;
  uint64_t *res_j_13;
  uint64_t c_13;
  uint64_t x_194;
  uint64_t *os_194;
  uint64_t x_193;
  uint64_t *os_193;
  uint64_t x_192;
  uint64_t *os_192;
  uint64_t x_191;
  uint64_t *os_191;
  uint64_t x_190;
  uint64_t *os_190;
  uint64_t x_189;
  uint64_t *os_189;
  uint64_t x_188;
  uint64_t *os_188;
  uint64_t x_187;
  uint64_t *os_187;
  uint64_t x_186;
  uint64_t *os_186;
  uint64_t x_185;
  uint64_t *os_185;
  uint64_t x_184;
  uint64_t *os_184;
  uint64_t x_183;
  uint64_t *os_183;
  uint64_t x_182;
  uint64_t *os_182;
  uint64_t x_181;
  uint64_t *os_181;
  uint64_t x_180;
  uint64_t *os_180;
  uint32_t i_14;
  uint64_t *res_j_12;
  uint64_t c_12;
  uint64_t x_179;
  uint64_t *os_179;
  uint64_t x_178;
  uint64_t *os_178;
  uint64_t x_177;
  uint64_t *os_177;
  uint64_t x_176;
  uint64_t *os_176;
  uint64_t x_175;
  uint64_t *os_175;
  uint64_t x_174;
  uint64_t *os_174;
  uint64_t x_173;
  uint64_t *os_173;
  uint64_t x_172;
  uint64_t *os_172;
  uint64_t x_171;
  uint64_t *os_171;
  uint64_t x_170;
  uint64_t *os_170;
  uint64_t x_169;
  uint64_t *os_169;
  uint64_t x_168;
  uint64_t *os_168;
  uint64_t x_167;
  uint64_t *os_167;
  uint64_t x_166;
  uint64_t *os_166;
  uint64_t x_165;
  uint64_t *os_165;
  uint32_t i_13;
  uint64_t *res_j_11;
  uint64_t c_11;
  uint64_t x_164;
  uint64_t *os_164;
  uint64_t x_163;
  uint64_t *os_163;
  uint64_t x_162;
  uint64_t *os_162;
  uint64_t x_161;
  uint64_t *os_161;
  uint64_t x_160;
  uint64_t *os_160;
  uint64_t x_159;
  uint64_t *os_159;
  uint64_t x_158;
  uint64_t *os_158;
  uint64_t x_157;
  uint64_t *os_157;
  uint64_t x_156;
  uint64_t *os_156;
  uint64_t x_155;
  uint64_t *os_155;
  uint64_t x_154;
  uint64_t *os_154;
  uint64_t x_153;
  uint64_t *os_153;
  uint64_t x_152;
  uint64_t *os_152;
  uint64_t x_151;
  uint64_t *os_151;
  uint64_t x_150;
  uint64_t *os_150;
  uint32_t i_12;
  uint64_t *res_j_10;
  uint64_t c_10;
  uint64_t x_149;
  uint64_t *os_149;
  uint64_t x_148;
  uint64_t *os_148;
  uint64_t x_147;
  uint64_t *os_147;
  uint64_t x_146;
  uint64_t *os_146;
  uint64_t x_145;
  uint64_t *os_145;
  uint64_t x_144;
  uint64_t *os_144;
  uint64_t x_143;
  uint64_t *os_143;
  uint64_t x_142;
  uint64_t *os_142;
  uint64_t x_141;
  uint64_t *os_141;
  uint64_t x_140;
  uint64_t *os_140;
  uint64_t x_139;
  uint64_t *os_139;
  uint64_t x_138;
  uint64_t *os_138;
  uint64_t x_137;
  uint64_t *os_137;
  uint64_t x_136;
  uint64_t *os_136;
  uint64_t x_135;
  uint64_t *os_135;
  uint32_t i_11;
  uint64_t *res_j_9;
  uint64_t c_9;
  uint64_t x_134;
  uint64_t *os_134;
  uint64_t x_133;
  uint64_t *os_133;
  uint64_t x_132;
  uint64_t *os_132;
  uint64_t x_131;
  uint64_t *os_131;
  uint64_t x_130;
  uint64_t *os_130;
  uint64_t x_129;
  uint64_t *os_129;
  uint64_t x_128;
  uint64_t *os_128;
  uint64_t x_127;
  uint64_t *os_127;
  uint64_t x_126;
  uint64_t *os_126;
  uint64_t x_125;
  uint64_t *os_125;
  uint64_t x_124;
  uint64_t *os_124;
  uint64_t x_123;
  uint64_t *os_123;
  uint64_t x_122;
  uint64_t *os_122;
  uint64_t x_121;
  uint64_t *os_121;
  uint64_t x_120;
  uint64_t *os_120;
  uint32_t i_10;
  uint64_t *res_j_8;
  uint64_t c_8;
  uint64_t x_119;
  uint64_t *os_119;
  uint64_t x_118;
  uint64_t *os_118;
  uint64_t x_117;
  uint64_t *os_117;
  uint64_t x_116;
  uint64_t *os_116;
  uint64_t x_115;
  uint64_t *os_115;
  uint64_t x_114;
  uint64_t *os_114;
  uint64_t x_113;
  uint64_t *os_113;
  uint64_t x_112;
  uint64_t *os_112;
  uint64_t x_111;
  uint64_t *os_111;
  uint64_t x_110;
  uint64_t *os_110;
  uint64_t x_109;
  uint64_t *os_109;
  uint64_t x_108;
  uint64_t *os_108;
  uint64_t x_107;
  uint64_t *os_107;
  uint64_t x_106;
  uint64_t *os_106;
  uint64_t x_105;
  uint64_t *os_105;
  uint32_t i_9;
  uint64_t *res_j_7;
  uint64_t c_7;
  uint64_t x_104;
  uint64_t *os_104;
  uint64_t x_103;
  uint64_t *os_103;
  uint64_t x_102;
  uint64_t *os_102;
  uint64_t x_101;
  uint64_t *os_101;
  uint64_t x_100;
  uint64_t *os_100;
  uint64_t x_99;
  uint64_t *os_99;
  uint64_t x_98;
  uint64_t *os_98;
  uint64_t x_97;
  uint64_t *os_97;
  uint64_t x_96;
  uint64_t *os_96;
  uint64_t x_95;
  uint64_t *os_95;
  uint64_t x_94;
  uint64_t *os_94;
  uint64_t x_93;
  uint64_t *os_93;
  uint64_t x_92;
  uint64_t *os_92;
  uint64_t x_91;
  uint64_t *os_91;
  uint64_t x_90;
  uint64_t *os_90;
  uint32_t i_8;
  uint64_t *res_j_6;
  uint64_t c_6;
  uint64_t x_89;
  uint64_t *os_89;
  uint64_t x_88;
  uint64_t *os_88;
  uint64_t x_87;
  uint64_t *os_87;
  uint64_t x_86;
  uint64_t *os_86;
  uint64_t x_85;
  uint64_t *os_85;
  uint64_t x_84;
  uint64_t *os_84;
  uint64_t x_83;
  uint64_t *os_83;
  uint64_t x_82;
  uint64_t *os_82;
  uint64_t x_81;
  uint64_t *os_81;
  uint64_t x_80;
  uint64_t *os_80;
  uint64_t x_79;
  uint64_t *os_79;
  uint64_t x_78;
  uint64_t *os_78;
  uint64_t x_77;
  uint64_t *os_77;
  uint64_t x_76;
  uint64_t *os_76;
  uint64_t x_75;
  uint64_t *os_75;
  uint32_t i_7;
  uint64_t *res_j_5;
  uint64_t c_5;
  uint64_t x_74;
  uint64_t *os_74;
  uint64_t x_73;
  uint64_t *os_73;
  uint64_t x_72;
  uint64_t *os_72;
  uint64_t x_71;
  uint64_t *os_71;
  uint64_t x_70;
  uint64_t *os_70;
  uint64_t x_69;
  uint64_t *os_69;
  uint64_t x_68;
  uint64_t *os_68;
  uint64_t x_67;
  uint64_t *os_67;
  uint64_t x_66;
  uint64_t *os_66;
  uint64_t x_65;
  uint64_t *os_65;
  uint64_t x_64;
  uint64_t *os_64;
  uint64_t x_63;
  uint64_t *os_63;
  uint64_t x_62;
  uint64_t *os_62;
  uint64_t x_61;
  uint64_t *os_61;
  uint64_t x_60;
  uint64_t *os_60;
  uint32_t i_6;
  uint64_t *res_j_4;
  uint64_t c_4;
  uint64_t x_59;
  uint64_t *os_59;
  uint64_t x_58;
  uint64_t *os_58;
  uint64_t x_57;
  uint64_t *os_57;
  uint64_t x_56;
  uint64_t *os_56;
  uint64_t x_55;
  uint64_t *os_55;
  uint64_t x_54;
  uint64_t *os_54;
  uint64_t x_53;
  uint64_t *os_53;
  uint64_t x_52;
  uint64_t *os_52;
  uint64_t x_51;
  uint64_t *os_51;
  uint64_t x_50;
  uint64_t *os_50;
  uint64_t x_49;
  uint64_t *os_49;
  uint64_t x_48;
  uint64_t *os_48;
  uint64_t x_47;
  uint64_t *os_47;
  uint64_t x_46;
  uint64_t *os_46;
  uint64_t x_45;
  uint64_t *os_45;
  uint32_t i_5;
  uint64_t *res_j_3;
  uint64_t c_3;
  uint64_t x_44;
  uint64_t *os_44;
  uint64_t x_43;
  uint64_t *os_43;
  uint64_t x_42;
  uint64_t *os_42;
  uint64_t x_41;
  uint64_t *os_41;
  uint64_t x_40;
  uint64_t *os_40;
  uint64_t x_39;
  uint64_t *os_39;
  uint64_t x_38;
  uint64_t *os_38;
  uint64_t x_37;
  uint64_t *os_37;
  uint64_t x_36;
  uint64_t *os_36;
  uint64_t x_35;
  uint64_t *os_35;
  uint64_t x_34;
  uint64_t *os_34;
  uint64_t x_33;
  uint64_t *os_33;
  uint64_t x_32;
  uint64_t *os_32;
  uint64_t x_31;
  uint64_t *os_31;
  uint64_t x_30;
  uint64_t *os_30;
  uint32_t i_4;
  uint64_t *res_j_2;
  uint64_t c_2;
  uint64_t x_29;
  uint64_t *os_29;
  uint64_t x_28;
  uint64_t *os_28;
  uint64_t x_27;
  uint64_t *os_27;
  uint64_t x_26;
  uint64_t *os_26;
  uint64_t x_25;
  uint64_t *os_25;
  uint64_t x_24;
  uint64_t *os_24;
  uint64_t x_23;
  uint64_t *os_23;
  uint64_t x_22;
  uint64_t *os_22;
  uint64_t x_21;
  uint64_t *os_21;
  uint64_t x_20;
  uint64_t *os_20;
  uint64_t x_19;
  uint64_t *os_19;
  uint64_t x_18;
  uint64_t *os_18;
  uint64_t x_17;
  uint64_t *os_17;
  uint64_t x_16;
  uint64_t *os_16;
  uint64_t x_15;
  uint64_t *os_15;
  uint32_t i_3;
  uint64_t *res_j_1;
  uint64_t c_1;
  uint64_t x_14;
  uint64_t *os_14;
  uint64_t x_13;
  uint64_t *os_13;
  uint64_t x_12;
  uint64_t *os_12;
  uint64_t x_11;
  uint64_t *os_11;
  uint64_t x_10;
  uint64_t *os_10;
  uint64_t x_9;
  uint64_t *os_9;
  uint64_t x_8;
  uint64_t *os_8;
  uint64_t x_7;
  uint64_t *os_7;
  uint64_t x_6;
  uint64_t *os_6;
  uint64_t x_5;
  uint64_t *os_5;
  uint64_t x_4;
  uint64_t *os_4;
  uint64_t x_3;
  uint64_t *os_3;
  uint64_t x_2;
  uint64_t *os_2;
  uint64_t x_1;
  uint64_t *os_1;
  uint64_t x;
  uint64_t *os;
  uint32_t i_2;
  uint64_t *res_j;
  uint64_t c;
  uint32_t i1;
  uint64_t bits_l;
  uint32_t k;
  uint32_t i_1;
  uint32_t i0;
  uint64_t tmp0 [15];
  uint64_t *t2_6;
  uint64_t *t11_6;
  uint64_t *t2_5;
  uint64_t *t11_5;
  uint64_t *t2_4;
  uint64_t *t11_4;
  uint64_t *t2_3;
  uint64_t *t11_3;
  uint64_t *t2_2;
  uint64_t *t11_2;
  uint64_t *t2_1;
  uint64_t *t11_1;
  uint64_t *t2;
  uint64_t *t11;
  uint32_t i;
  uint64_t *t1;
  uint64_t *t0;
  uint64_t tmp [15];
  uint64_t local_7a8;
  uint64_t table [240];
  uint64_t *q_local;
  uint64_t *scalar_local;
  uint64_t *out_local;
  
  memset(&local_7a8,0,0x780);
  memset(&t0,0,0x78);
  Hacl_Impl_K256_Point_make_point_at_inf(&local_7a8);
  memcpy(table + 0xe,q,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0xe);
  memcpy(table + 0x1d,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0x1d);
  memcpy(table + 0x2c,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x1d);
  memcpy(table + 0x3b,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0x3b);
  memcpy(table + 0x4a,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x2c);
  memcpy(table + 0x59,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0x59);
  memcpy(table + 0x68,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x3b);
  memcpy(table + 0x77,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0x77);
  memcpy(table + 0x86,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x4a);
  memcpy(table + 0x95,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0x95);
  memcpy(table + 0xa4,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x59);
  memcpy(table + 0xb3,&t0,0x78);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,table + 0xb3);
  memcpy(table + 0xc2,&t0,0x78);
  Hacl_Impl_K256_PointDouble_point_double((uint64_t *)&t0,table + 0x68);
  memcpy(table + 0xd1,&t0,0x78);
  tmp0[0xe] = (uint64_t)(table + 0xd1);
  Hacl_Impl_K256_PointAdd_point_add((uint64_t *)&t0,q,(uint64_t *)tmp0[0xe]);
  memcpy(table + 0xe0,&t0,0x78);
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  memset(&i_1,0,0x78);
  for (k = 0; k < 0x40; k = k + 1) {
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(4,scalar,k * -4 + 0xfc,4);
    memcpy(&i_1,&local_7a8,0x78);
    uVar2 = FStar_UInt64_eq_mask(uVar1,1);
    _i_1 = uVar2 & table[0xe] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0xf] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x10] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x11] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x12] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x13] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x14] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x15] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x16] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x17] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x18] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x19] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x1a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x1b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x1c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,2);
    _i_1 = uVar2 & table[0x1d] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x1e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x1f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x20] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x21] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x22] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x23] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x24] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x25] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x26] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x27] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x28] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x29] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x2a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x2b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,3);
    _i_1 = uVar2 & table[0x2c] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x2d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x2e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x2f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x30] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x31] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x32] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x33] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x34] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x35] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x36] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x37] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x38] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x39] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x3a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,4);
    _i_1 = uVar2 & table[0x3b] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x3c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x3d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x3e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x3f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x40] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x41] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x42] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x43] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x44] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x45] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x46] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x47] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x48] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x49] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,5);
    _i_1 = uVar2 & table[0x4a] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x4b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x4c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x4d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x4e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x4f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x50] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x51] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x52] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x53] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x54] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x55] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x56] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x57] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x58] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,6);
    _i_1 = uVar2 & table[0x59] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x5a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x5b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x5c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x5d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x5e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x5f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x60] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x61] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x62] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[99] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[100] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x65] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x66] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x67] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,7);
    _i_1 = uVar2 & table[0x68] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x69] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x6a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x6b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x6c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x6d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x6e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x6f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x70] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x71] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x72] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x73] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x74] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x75] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x76] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,8);
    _i_1 = uVar2 & table[0x77] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x78] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x79] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x7a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x7b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x7c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x7d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x7e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x7f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x80] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x81] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x82] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x83] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x84] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x85] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,9);
    _i_1 = uVar2 & table[0x86] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x87] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x88] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x89] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x8a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x8b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x8c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x8d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x8e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x8f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x90] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0x91] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0x92] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0x93] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0x94] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,10);
    _i_1 = uVar2 & table[0x95] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0x96] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0x97] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0x98] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0x99] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0x9a] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0x9b] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0x9c] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0x9d] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0x9e] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0x9f] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0xa0] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0xa1] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0xa2] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0xa3] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,0xb);
    _i_1 = uVar2 & table[0xa4] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0xa5] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0xa6] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0xa7] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0xa8] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0xa9] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0xaa] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0xab] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0xac] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0xad] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0xae] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0xaf] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0xb0] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0xb1] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0xb2] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,0xc);
    _i_1 = uVar2 & table[0xb3] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0xb4] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0xb5] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0xb6] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0xb7] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0xb8] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0xb9] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0xba] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0xbb] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0xbc] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0xbd] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0xbe] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0xbf] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0xc0] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0xc1] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,0xd);
    _i_1 = uVar2 & table[0xc2] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0xc3] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0xc4] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0xc5] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0xc6] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[199] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[200] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0xc9] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0xca] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0xcb] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0xcc] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0xcd] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0xce] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0xcf] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0xd0] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar2 = FStar_UInt64_eq_mask(uVar1,0xe);
    _i_1 = uVar2 & table[0xd1] | (uVar2 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar2 & table[0xd2] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar2 & table[0xd3] | (uVar2 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar2 & table[0xd4] | (uVar2 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar2 & table[0xd5] | (uVar2 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar2 & table[0xd6] | (uVar2 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar2 & table[0xd7] | (uVar2 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar2 & table[0xd8] | (uVar2 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar2 & table[0xd9] | (uVar2 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar2 & table[0xda] | (uVar2 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar2 & table[0xdb] | (uVar2 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar2 & table[0xdc] | (uVar2 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar2 & table[0xdd] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar2 & table[0xde] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar2 & table[0xdf] | (uVar2 ^ 0xffffffffffffffff) & tmp0[0xd];
    uVar1 = FStar_UInt64_eq_mask(uVar1,0xf);
    _i_1 = uVar1 & table[0xe0] | (uVar1 ^ 0xffffffffffffffff) & _i_1;
    tmp0[0] = uVar1 & table[0xe1] | (uVar1 ^ 0xffffffffffffffff) & tmp0[0];
    tmp0[1] = uVar1 & table[0xe2] | (uVar1 ^ 0xffffffffffffffff) & tmp0[1];
    tmp0[2] = uVar1 & table[0xe3] | (uVar1 ^ 0xffffffffffffffff) & tmp0[2];
    tmp0[3] = uVar1 & table[0xe4] | (uVar1 ^ 0xffffffffffffffff) & tmp0[3];
    tmp0[4] = uVar1 & table[0xe5] | (uVar1 ^ 0xffffffffffffffff) & tmp0[4];
    tmp0[5] = uVar1 & table[0xe6] | (uVar1 ^ 0xffffffffffffffff) & tmp0[5];
    tmp0[6] = uVar1 & table[0xe7] | (uVar1 ^ 0xffffffffffffffff) & tmp0[6];
    tmp0[7] = uVar1 & table[0xe8] | (uVar1 ^ 0xffffffffffffffff) & tmp0[7];
    tmp0[8] = uVar1 & table[0xe9] | (uVar1 ^ 0xffffffffffffffff) & tmp0[8];
    tmp0[9] = uVar1 & table[0xea] | (uVar1 ^ 0xffffffffffffffff) & tmp0[9];
    tmp0[10] = uVar1 & table[0xeb] | (uVar1 ^ 0xffffffffffffffff) & tmp0[10];
    tmp0[0xb] = uVar1 & table[0xec] | (uVar1 ^ 0xffffffffffffffff) & tmp0[0xb];
    tmp0[0xc] = uVar1 & table[0xed] | (uVar1 ^ 0xffffffffffffffff) & tmp0[0xc];
    tmp0[0xd] = uVar1 & table[0xee] | (uVar1 ^ 0xffffffffffffffff) & tmp0[0xd];
    Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i_1);
  }
  return;
}

Assistant:

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out, uint64_t *scalar, uint64_t *q)
{
  uint64_t table[240U] = { 0U };
  uint64_t tmp[15U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 15U;
  Hacl_Impl_K256_Point_make_point_at_inf(t0);
  memcpy(t1, q, 15U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 15U;
    Hacl_Impl_K256_PointDouble_point_double(tmp, t11);
    memcpy(table + (2U * i + 2U) * 15U, tmp, 15U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 15U;
    Hacl_Impl_K256_PointAdd_point_add(tmp, q, t2);
    memcpy(table + (2U * i + 3U) * 15U, tmp, 15U * sizeof (uint64_t)););
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  uint64_t tmp0[15U] = { 0U };
  for (uint32_t i0 = 0U; i0 < 64U; i0++)
  {
    KRML_MAYBE_FOR4(i, 0U, 4U, 1U, Hacl_Impl_K256_PointDouble_point_double(out, out););
    uint32_t k = 256U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(4U, scalar, k, 4U);
    memcpy(tmp0, (uint64_t *)table, 15U * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * 15U;
      KRML_MAYBE_FOR15(i,
        0U,
        15U,
        1U,
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp0);
  }
}